

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

string_view __thiscall
slang::ast::Compilation::checkDPIMethods::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,Scope *scope,Token cid,Token name)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  Diagnostic *this_00;
  size_t sVar4;
  Token *pTVar6;
  string_view sVar7;
  SourceRange sourceRange;
  Scope *local_48;
  Info *local_40;
  Info *local_38;
  Info *local_30;
  char *pcVar5;
  
  local_30 = name._0_8_;
  local_38 = cid.info;
  local_40 = cid._0_8_;
  pTVar6 = (Token *)&local_48;
  if (local_40 == (Info *)0x0) {
    pTVar6 = (Token *)&local_38;
  }
  local_48 = scope;
  sVar7 = parsing::Token::valueText(pTVar6);
  pcVar5 = sVar7._M_str;
  sVar2 = sVar7._M_len;
  if (sVar2 != 0) {
    cVar1 = *pcVar5;
    if ((byte)(cVar1 + 0x9fU) < 0x1a || (byte)(cVar1 - 0x30U) < 10) {
      if (9 < (byte)(cVar1 - 0x30U)) {
LAB_00291589:
        sVar3 = 1;
        sVar4 = sVar3;
        if (sVar2 != 1) {
          do {
            cVar1 = pcVar5[sVar3];
            if ((0x19 < (byte)(cVar1 + 0x9fU) && 9 < (byte)(cVar1 - 0x30U)) &&
               (cVar1 != '_' && (byte)(cVar1 + 0xa5U) < 0xe6)) goto LAB_002915d0;
            sVar3 = sVar3 + 1;
            sVar4 = sVar2;
          } while (sVar2 != sVar3);
        }
        goto LAB_00291607;
      }
    }
    else if (cVar1 == '_' || (byte)(cVar1 + 0xbfU) < 0x1a) goto LAB_00291589;
LAB_002915d0:
    pTVar6 = (Token *)&local_48;
    if (local_40 == (Info *)0x0) {
      pTVar6 = (Token *)&local_38;
    }
    sourceRange = parsing::Token::range(pTVar6);
    this_00 = Scope::addDiag((Scope *)this,(DiagCode)0xe000d,sourceRange);
    Diagnostic::operator<<(this_00,sVar7);
    pcVar5 = (char *)0x0;
  }
  sVar4 = 0;
LAB_00291607:
  sVar7._M_str = pcVar5;
  sVar7._M_len = sVar4;
  return sVar7;
}

Assistant:

void Compilation::checkDPIMethods(std::span<const SubroutineSymbol* const> dpiImports) {
    auto getCId = [&](const Scope& scope, Token cid, Token name) {
        std::string_view text = cid ? cid.valueText() : name.valueText();
        if (!text.empty()) {
            auto tail = text.substr(1);
            if (!isValidCIdChar(text[0]) || isDecimalDigit(text[0]) ||
                std::ranges::any_of(tail, [](char c) { return !isValidCIdChar(c); })) {
                scope.addDiag(diag::InvalidDPICIdentifier, cid ? cid.range() : name.range())
                    << text;
                return std::string_view();
            }
        }
        return text;
    };

    flat_hash_map<std::string_view, const SubroutineSymbol*> nameMap;
    for (auto sub : dpiImports) {
        auto syntax = sub->getSyntax();
        SLANG_ASSERT(syntax);

        auto scope = sub->getParentScope();
        SLANG_ASSERT(scope);

        auto& dis = syntax->as<DPIImportSyntax>();
        std::string_view cId = getCId(*scope, dis.c_identifier, dis.method->name->getLastToken());
        if (cId.empty())
            continue;

        auto [it, inserted] = nameMap.emplace(cId, sub);
        if (!inserted) {
            if (!checkSignaturesMatch(*sub, *it->second)) {
                auto& diag = scope->addDiag(diag::DPISignatureMismatch, sub->location);
                diag << cId;
                diag.addNote(diag::NotePreviousDefinition, it->second->location);
            }
        }
    }

    flat_hash_map<std::tuple<std::string_view, const Scope*>, const DPIExportSyntax*>
        exportsByScope;
    flat_hash_map<const SubroutineSymbol*, const DPIExportSyntax*> previousExports;
    auto exports = dpiExports;
    for (auto [syntax, scope] : exports) {
        if (syntax->specString.valueText() == "DPI")
            scope->addDiag(diag::DPISpecDisallowed, syntax->specString.range());

        auto name = syntax->name.valueText();
        auto symbol = Lookup::unqualifiedAt(*scope, name, LookupLocation::max,
                                            syntax->name.range());
        if (!symbol)
            continue;

        if (symbol->kind != SymbolKind::Subroutine) {
            auto& diag = scope->addDiag(diag::NotASubroutine, syntax->name.range()) << name;
            diag.addNote(diag::NoteDeclarationHere, symbol->location);
            continue;
        }

        // This check is a little verbose because we're avoiding issuing an error if the
        // functionOrTask keyword is invalid, i.e. not 'function' or 'task'.
        auto& sub = symbol->as<SubroutineSymbol>();
        if ((sub.subroutineKind == SubroutineKind::Function &&
             syntax->functionOrTask.kind == TokenKind::TaskKeyword) ||
            (sub.subroutineKind == SubroutineKind::Task &&
             syntax->functionOrTask.kind == TokenKind::FunctionKeyword)) {
            auto& diag = scope->addDiag(diag::DPIExportKindMismatch,
                                        syntax->functionOrTask.range());
            diag.addNote(diag::NoteDeclarationHere, symbol->location);
            continue;
        }

        if (sub.getParentScope() != scope) {
            auto& diag = scope->addDiag(diag::DPIExportDifferentScope, syntax->name.range());
            diag.addNote(diag::NoteDeclarationHere, sub.location);
            continue;
        }

        if (sub.flags.has(MethodFlags::DPIImport)) {
            auto& diag = scope->addDiag(diag::DPIExportImportedFunc, syntax->name.range());
            diag.addNote(diag::NoteDeclarationHere, sub.location);
            continue;
        }

        auto& retType = sub.getReturnType();
        if (!retType.isValidForDPIReturn() && !retType.isError()) {
            auto& diag = scope->addDiag(diag::InvalidDPIReturnType, sub.location);
            diag << retType;
            diag.addNote(diag::NoteDeclarationHere, syntax->name.location());
            continue;
        }

        for (auto arg : sub.getArguments()) {
            if (arg->direction == ArgumentDirection::Ref)
                scope->addDiag(diag::DPIRefArg, arg->location);

            auto& type = arg->getType();
            if (!type.isValidForDPIArg() && !type.isError()) {
                auto& diag = scope->addDiag(diag::InvalidDPIArgType, arg->location);
                diag << type;
                diag.addNote(diag::NoteDeclarationHere, syntax->name.location());
                continue;
            }
        }

        {
            auto [it, inserted] = previousExports.emplace(&sub, syntax);
            if (!inserted) {
                auto& diag = scope->addDiag(diag::DPIExportDuplicate, syntax->name.range())
                             << sub.name;
                diag.addNote(diag::NotePreviousDefinition, it->second->name.location());
                continue;
            }
        }

        std::string_view cId = getCId(*scope, syntax->c_identifier, syntax->name);
        if (!cId.empty()) {
            {
                auto [it, inserted] = nameMap.emplace(cId, &sub);
                if (!inserted) {
                    if (!checkSignaturesMatch(sub, *it->second)) {
                        auto& diag = scope->addDiag(diag::DPISignatureMismatch,
                                                    syntax->name.range());
                        diag << cId;
                        diag.addNote(diag::NotePreviousDefinition, it->second->location);
                    }
                }
            }
            {
                auto [it, inserted] = exportsByScope.emplace(std::make_tuple(cId, scope), syntax);
                if (!inserted) {
                    auto& diag = scope->addDiag(diag::DPIExportDuplicateCId, syntax->name.range());
                    diag << cId;
                    diag.addNote(diag::NotePreviousDefinition, it->second->name.location());
                }
            }
        }
    }
}